

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QCom.cpp
# Opt level: O3

void server::allowmaster_cmd(int cid,char **args,int argc)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  
  bVar1 = QServ::getlastSA(&qs);
  if (bVar1) {
    uVar2 = atoi(args[1]);
    if ((uVar2 ^ 1) == 0 && (mastermask ^ 3) == 0) {
      switchallowmaster();
      iVar3 = QServ::getSender(&qs);
      QServ::getClient(&qs,iVar3);
      pcVar4 = "\f7Claiming \f0master \f7with \"/setmaster 1\" is now \f0enabled";
LAB_00157558:
      out(3,pcVar4);
      return;
    }
    if (uVar2 == 0 && (mastermask ^ 0x100f) == 0) {
      switchdisallowmaster();
      pcVar4 = "\f7Claiming \f0master \f7with \"/setmaster 1\" is now \f3disabled";
      goto LAB_00157558;
    }
    if ((mastermask ^ 3) == 0 && uVar2 == 0) {
      iVar3 = QServ::getSender(&qs);
      pcVar4 = "\f3Error: Master is already disabled. Use \f2#allowmaster 1 \f3to enable it.";
      goto LAB_001575fe;
    }
    if ((uVar2 ^ 1) == 0 && (mastermask ^ 0x100f) == 0) {
      iVar3 = QServ::getSender(&qs);
      pcVar4 = "\f3Error: Master is already enabled. Use \f2#allowmaster 0 \f3to disable it.";
      goto LAB_001575fe;
    }
    if (((uVar2 != 0) && (iVar3 = isalpha(uVar2), uVar2 == 1)) && (iVar3 == 0)) {
      return;
    }
  }
  iVar3 = QServ::getSender(&qs);
  pcVar4 = QServ::getCommandDesc(&qs,cid);
LAB_001575fe:
  sendf(iVar3,1,"ris",0x23,pcVar4);
  return;
}

Assistant:

QSERV_CALLBACK allowmaster_cmd(p) {
        bool usage = false;
        int togglenum = -1;
        if(CMD_SA) {
            togglenum = atoi(args[1]);
                if(togglenum==1 && mastermask == MM_PUBSERV) {
                    switchallowmaster();
                    clientinfo *ci = qs.getClient(CMD_SENDER);
                    out(ECHO_SERV, "\f7Claiming \f0master \f7with \"/setmaster 1\" is now \f0enabled");
                }
                else if(togglenum==0 && mastermask == MM_PRIVSERV) {
                    switchdisallowmaster();
                    out(ECHO_SERV, "\f7Claiming \f0master \f7with \"/setmaster 1\" is now \f3disabled");
                }
                else if(togglenum==0 && mastermask == MM_PUBSERV) sendf(CMD_SENDER, 1, "ris", N_SERVMSG, "\f3Error: Master is already disabled. Use \f2#allowmaster 1 \f3to enable it.");
                else if(togglenum==1 && mastermask == MM_PRIVSERV) sendf(CMD_SENDER, 1, "ris", N_SERVMSG, "\f3Error: Master is already enabled. Use \f2#allowmaster 0 \f3to disable it.");
                else if(togglenum==NULL || isalpha(togglenum) || togglenum < 0 || togglenum > 1) usage = true;
        } else {
            togglenum = -1;
            usage = true;
        }
        if(usage) sendf(CMD_SENDER, 1, "ris", N_SERVMSG, CMD_DESC(cid));
    }